

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FillLeftConvexEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Point *pPVar4;
  Point *pPVar5;
  double dVar6;
  
  while( true ) {
    node = node->prev;
    pPVar4 = node->prev->point;
    pPVar5 = node->prev->prev->point;
    dVar6 = pPVar5->x;
    dVar1 = pPVar5->y;
    dVar2 = pPVar4->x;
    dVar3 = pPVar4->y;
    dVar6 = (dVar3 - dVar1) * (node->point->x - dVar6) - (dVar2 - dVar6) * (node->point->y - dVar1);
    if ((1e-12 <= ABS(dVar6)) && (dVar6 <= 0.0)) break;
    dVar6 = edge->p->x;
    dVar1 = edge->p->y;
    dVar6 = (dVar3 - dVar1) * (edge->q->x - dVar6) - (dVar2 - dVar6) * (edge->q->y - dVar1);
    if ((ABS(dVar6) < 1e-12) || (0.0 < dVar6)) {
      return;
    }
  }
  while( true ) {
    Fill(this,tcx,node->prev);
    pPVar4 = node->prev->point;
    pPVar5 = edge->p;
    if (pPVar4 == pPVar5) {
      return;
    }
    dVar6 = (pPVar4->y - pPVar5->y) * (edge->q->x - pPVar5->x) -
            (pPVar4->x - pPVar5->x) * (edge->q->y - pPVar5->y);
    if (ABS(dVar6) < 1e-12) {
      return;
    }
    if (0.0 < dVar6) {
      return;
    }
    pPVar5 = node->prev->prev->point;
    dVar6 = pPVar5->x;
    dVar1 = pPVar5->y;
    dVar6 = (pPVar4->y - dVar1) * (node->point->x - dVar6) -
            (pPVar4->x - dVar6) * (node->point->y - dVar1);
    if (ABS(dVar6) < 1e-12) break;
    if (0.0 < dVar6) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftConvexEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  // Next concave or convex?
  if (Orient2d(*node.prev->point, *node.prev->prev->point, *node.prev->prev->prev->point) == CW) {
    // Concave
    FillLeftConcaveEdgeEvent(tcx, edge, *node.prev);
  } else{
    // Convex
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->prev->point, *edge->p) == CW) {
      // Below
      FillLeftConvexEdgeEvent(tcx, edge, *node.prev);
    } else{
      // Above
    }
  }
}